

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListBuilder * __thiscall
capnp::_::PointerBuilder::getStructList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,StructSize elementSize,
          word *defaultValue)

{
  ushort uVar1;
  ushort uVar2;
  SegmentBuilder *pSVar3;
  undefined8 *puVar4;
  word *pwVar5;
  word *pwVar6;
  byte bVar7;
  StructPointerCount SVar8;
  WirePointer *pWVar9;
  WirePointer *pWVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  BuilderArena *pBVar14;
  ulong uVar15;
  uint amount;
  uint uVar16;
  int iVar17;
  StructSize SVar18;
  uint uVar19;
  WirePointer *dst;
  CapTableBuilder *pCVar20;
  AllocateResult AVar21;
  AllocateResult AVar22;
  AllocateResult AVar23;
  Iterator __end5;
  Fault f;
  Iterator __end4;
  WirePointer *local_e0;
  AllocateResult local_d8;
  WirePointer *local_c8;
  word *local_c0;
  CapTableBuilder *local_b8;
  Fault local_b0;
  ulong local_a8;
  WirePointer *local_a0;
  ulong local_98;
  WirePointer *local_90;
  BuilderArena *local_88;
  ListBuilder *local_80;
  ulong local_78;
  SegmentBuilder *local_70;
  uint local_64;
  word *local_60;
  size_t local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_d8.words = (word *)this->pointer;
  local_d8.segment = this->segment;
  pCVar20 = this->capTable;
  uVar11 = (uint)elementSize >> 0x10;
  uVar15 = (ulong)uVar11;
  if ((((WirePointer *)local_d8.words)->field_1).upper32Bits == 0 &&
      (((WirePointer *)local_d8.words)->offsetAndKind).value == 0) goto LAB_0014b68c;
  local_a0 = (WirePointer *)local_d8.words +
             (long)((int)(((WirePointer *)local_d8.words)->offsetAndKind).value >> 2) + 1;
  do {
    pwVar6 = local_d8.words;
    pWVar9 = (WirePointer *)local_d8.words;
    pSVar3 = local_d8.segment;
    if ((((WireValue<uint32_t> *)&(local_d8.words)->content)->value & 3) == 2) {
      pSVar3 = BuilderArena::getSegment
                         ((BuilderArena *)((local_d8.segment)->super_SegmentReader).arena,
                          (SegmentId)
                          ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_d8.words + 4))
                          ->structRef);
      uVar19 = ((WireValue<uint32_t> *)&pwVar6->content)->value;
      pwVar6 = (pSVar3->super_SegmentReader).ptr.ptr;
      uVar13 = (ulong)(uVar19 & 0xfffffff8);
      pWVar10 = (WirePointer *)((long)&pwVar6->content + uVar13);
      pWVar9 = (WirePointer *)((long)&pwVar6[1].content + uVar13);
      if ((uVar19 & 4) == 0) {
        local_a0 = pWVar9 + ((int)(pWVar10->offsetAndKind).value >> 2);
        pWVar9 = pWVar10;
      }
      else {
        pSVar3 = BuilderArena::getSegment
                           ((BuilderArena *)(pSVar3->super_SegmentReader).arena,
                            (SegmentId)(pWVar10->field_1).structRef);
        local_a0 = (WirePointer *)
                   ((long)&((pSVar3->super_SegmentReader).ptr.ptr)->content +
                   (ulong)((pWVar10->offsetAndKind).value & 0xfffffff8));
      }
    }
    local_70 = pSVar3;
    if (pSVar3->readOnly == true) {
      SegmentBuilder::throwNotWritable(pSVar3);
    }
    pwVar6 = local_d8.words;
    pSVar3 = local_d8.segment;
    if (((pWVar9->offsetAndKind).value & 3) == 1) {
      uVar19 = (pWVar9->field_1).upper32Bits;
      bVar7 = (byte)uVar19 & 7;
      local_e0._0_2_ = elementSize.data;
      if (bVar7 == 7) {
        uVar19 = (uint)*(uint64_t *)&(local_a0->offsetAndKind).value;
        if ((uVar19 & 3) == 0) {
          local_c8 = local_a0 + 1;
          uVar1 = *(ushort *)&local_a0->field_1;
          uVar2 = *(ushort *)((long)&local_a0->field_1 + 2);
          local_88 = (BuilderArena *)(ulong)uVar2;
          uVar11 = (uint)uVar2 + (uint)uVar1;
          uVar19 = uVar19 >> 2 & 0x1fffffff;
          uVar13 = (ulong)uVar19;
          SVar18.pointers = 0;
          SVar18.data = uVar1;
          if (uVar2 < elementSize.pointers || uVar1 < (ushort)local_e0) {
            if (uVar1 <= (ushort)local_e0) {
              SVar18 = elementSize;
            }
            local_78 = CONCAT44(local_78._4_4_,(uint)uVar2);
            if (elementSize.pointers < uVar2) {
              uVar15 = (ulong)(uint)uVar2;
            }
            local_64 = (uint)SVar18 & 0xffff;
            local_c0 = (word *)(ulong)((int)uVar15 + local_64);
            uVar12 = (long)local_c0 * uVar13;
            local_b8 = pCVar20;
            local_a8 = uVar15;
            local_80 = __return_storage_ptr__;
            if (0x1ffffffe < uVar12) {
              WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_b0);
            }
            pwVar6 = local_d8.words;
            if (((((WireValue<uint32_t> *)&(local_d8.words)->content)->value & 3) == 2) &&
               (pSVar3 = BuilderArena::getSegment
                                   ((BuilderArena *)((local_d8.segment)->super_SegmentReader).arena,
                                    (SegmentId)
                                    ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)
                                    ((long)local_d8.words + 4))->structRef),
               pSVar3->readOnly == false)) {
              uVar19 = ((WireValue<uint32_t> *)&pwVar6->content)->value;
              puVar4 = (undefined8 *)
                       ((long)&((pSVar3->super_SegmentReader).ptr.ptr)->content +
                       (ulong)(uVar19 & 0xfffffff8));
              if ((uVar19 & 4) == 0) {
                *puVar4 = 0;
              }
              else {
                *puVar4 = 0;
                puVar4[1] = 0;
              }
            }
            *pwVar6 = 0;
            if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_d8.words + 4))->
                upper32Bits != 0 || ((WireValue<uint32_t> *)&(local_d8.words)->content)->value != 0)
            {
              WireHelpers::zeroObject(local_d8.segment,local_b8,(WirePointer *)local_d8.words);
            }
            AVar22.words = local_d8.words;
            AVar22.segment = local_d8.segment;
            pwVar6 = (local_d8.segment)->pos;
            uVar15 = uVar12 + 1 & 0xffffffff;
            if ((long)((long)((local_d8.segment)->super_SegmentReader).ptr.ptr +
                      (((local_d8.segment)->super_SegmentReader).ptr.size_ * 8 - (long)pwVar6)) >> 3
                < (long)uVar15) {
              pwVar6 = (word *)0x0;
            }
            else {
              (local_d8.segment)->pos = pwVar6 + uVar15;
            }
            local_98 = uVar13;
            if (pwVar6 == (word *)0x0) {
              uVar19 = (int)uVar12 + 2;
              pBVar14 = (BuilderArena *)((local_d8.segment)->super_SegmentReader).arena;
              if (0x1fffffff < uVar19) {
                WireHelpers::allocate::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&local_b0);
              }
              AVar22 = BuilderArena::allocate(pBVar14,uVar19);
              ((WireValue<uint32_t> *)&(local_d8.words)->content)->value =
                   (int)AVar22.words - *(int *)&((AVar22.segment)->super_SegmentReader).ptr.ptr &
                   0xfffffff8U | 2;
              *(uint *)((long)local_d8.words + 4) = ((AVar22.segment)->super_SegmentReader).id.value
              ;
              *(undefined4 *)&(AVar22.words)->content = 1;
              pwVar6 = AVar22.words + 1;
            }
            else {
              ((WireValue<uint32_t> *)&(local_d8.words)->content)->value =
                   ((uint)((ulong)((long)pwVar6 - (long)local_d8.words) >> 1) & 0xfffffffc) - 3;
            }
            local_d8.words = AVar22.words;
            *(int *)((long)&(local_d8.words)->content + 4) = (int)uVar12 * 8 + 7;
            *(int *)&pwVar6->content = (int)local_98 * 4;
            *(StructDataWordCount *)((long)&pwVar6->content + 4) = SVar18.data;
            *(short *)((long)&pwVar6->content + 6) = (short)local_a8;
            pwVar5 = pwVar6 + 1;
            uVar15 = (ulong)uVar11;
            local_60 = pwVar5;
            if ((int)local_98 != 0) {
              local_58 = (ulong)uVar1 * 8;
              local_e0 = (WirePointer *)(pwVar6 + ((ulong)(uint)SVar18 & 0xffff) + 1);
              local_50 = (ulong)(uint)((int)local_c0 * 8);
              local_90 = local_a0 + (ulong)uVar1 + 1;
              local_40 = (ulong)(uVar11 * 8);
              iVar17 = 0;
              pWVar9 = local_c8;
              local_48 = (ulong)uVar11;
              local_38 = (ulong)uVar1;
              do {
                local_d8 = AVar22;
                if ((short)local_38 != 0) {
                  memcpy(pwVar5,pWVar9,local_58);
                }
                pSVar3 = local_70;
                pWVar10 = local_90;
                pBVar14 = local_88;
                dst = local_e0;
                local_c8 = pWVar9;
                AVar22 = local_d8;
                if ((short)local_78 != 0) {
                  do {
                    WireHelpers::transferPointer(local_d8.segment,dst,pSVar3,pWVar10);
                    dst = dst + 1;
                    pWVar10 = pWVar10 + 1;
                    pBVar14 = (BuilderArena *)((long)pBVar14 - 1);
                    AVar22 = local_d8;
                  } while (pBVar14 != (BuilderArena *)0x0);
                }
                pwVar5 = pwVar5 + (long)local_c0;
                pWVar9 = local_c8 + local_48;
                iVar17 = iVar17 + 1;
                local_e0 = (WirePointer *)((long)&(local_e0->offsetAndKind).value + local_50);
                local_90 = (WirePointer *)((long)&(local_90->offsetAndKind).value + local_40);
                uVar15 = local_48;
              } while (iVar17 != (int)local_98);
            }
            __return_storage_ptr__ = local_80;
            uVar15 = uVar15 * local_98;
            local_d8 = AVar22;
            if (0x1ffffffe < uVar15) {
              WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_b0);
            }
            pCVar20 = local_b8;
            iVar17 = (int)uVar15 + 1;
            SVar8 = (StructPointerCount)local_a8;
            if (iVar17 != 0) {
              memset(local_a0,0,(ulong)(uint)(iVar17 * 8));
            }
            __return_storage_ptr__->segment = local_d8.segment;
            __return_storage_ptr__->capTable = pCVar20;
            __return_storage_ptr__->ptr = (byte *)local_60;
            __return_storage_ptr__->elementCount = (ListElementCount)local_98;
            __return_storage_ptr__->step = (int)local_c0 << 6;
            __return_storage_ptr__->structDataSize = local_64 << 6;
LAB_0014bfbf:
            __return_storage_ptr__->structPointerCount = SVar8;
          }
          else {
            __return_storage_ptr__->segment = local_70;
            __return_storage_ptr__->capTable = pCVar20;
            __return_storage_ptr__->ptr = (byte *)local_c8;
            __return_storage_ptr__->elementCount = uVar19;
            __return_storage_ptr__->step = uVar11 * 0x40;
            __return_storage_ptr__->structDataSize = (uint)uVar1 << 6;
            __return_storage_ptr__->structPointerCount = uVar2;
          }
          goto LAB_0014bfc5;
        }
        getStructList();
      }
      else {
        local_c8 = (WirePointer *)(ulong)(uVar19 >> 3);
        if ((uVar19 & 7) == 0) {
          AVar21.words = local_d8.words;
          AVar21.segment = local_d8.segment;
          uVar11 = uVar11 + ((uint)elementSize & 0xffff);
          uVar13 = (ulong)uVar11 * (long)local_c8;
          local_b8 = pCVar20;
          local_a8 = uVar15;
          local_80 = __return_storage_ptr__;
          if (0x1ffffffe < uVar13) {
            WireHelpers::initStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_b0);
          }
          if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)pwVar6 + 4))->upper32Bits != 0 ||
              ((WireValue<uint32_t> *)&pwVar6->content)->value != 0) {
            WireHelpers::zeroObject(pSVar3,local_b8,(WirePointer *)pwVar6);
          }
          pwVar5 = pSVar3->pos;
          uVar15 = uVar13 + 1 & 0xffffffff;
          if ((long)((long)(pSVar3->super_SegmentReader).ptr.ptr +
                    ((pSVar3->super_SegmentReader).ptr.size_ * 8 - (long)pwVar5)) >> 3 <
              (long)uVar15) {
            pwVar5 = (word *)0x0;
          }
          else {
            pSVar3->pos = pwVar5 + uVar15;
          }
          if (pwVar5 == (word *)0x0) {
            uVar19 = (int)uVar13 + 2;
            pBVar14 = (BuilderArena *)(pSVar3->super_SegmentReader).arena;
            if (0x1fffffff < uVar19) {
              WireHelpers::allocate::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_b0);
            }
            AVar21 = BuilderArena::allocate(pBVar14,uVar19);
            ((WireValue<uint32_t> *)&pwVar6->content)->value =
                 (int)AVar21.words - *(int *)&((AVar21.segment)->super_SegmentReader).ptr.ptr &
                 0xfffffff8U | 2;
            *(uint *)((long)pwVar6 + 4) = ((AVar21.segment)->super_SegmentReader).id.value;
            *(undefined4 *)&(AVar21.words)->content = 1;
            pwVar5 = AVar21.words + 1;
          }
          else {
            ((WireValue<uint32_t> *)&pwVar6->content)->value =
                 ((uint)((ulong)((long)pwVar5 - (long)pwVar6) >> 1) & 0xfffffffc) - 3;
          }
          *(int *)((long)&(AVar21.words)->content + 4) = (int)uVar13 * 8 + 7;
          *(ListElementCount *)&pwVar5->content = (ListElementCount)local_c8 * 4;
          *(ushort *)((long)&pwVar5->content + 4) = (ushort)local_e0;
          *(StructPointerCount *)((long)&pwVar5->content + 6) = (StructPointerCount)local_a8;
          local_80->segment = AVar21.segment;
          local_80->capTable = local_b8;
          local_80->ptr = (byte *)(pwVar5 + 1);
          local_80->elementCount = (ListElementCount)local_c8;
          local_80->step = uVar11 * 0x40;
          local_80->structDataSize = ((uint)elementSize & 0xffff) << 6;
          local_80->structPointerCount = (StructPointerCount)local_a8;
          __return_storage_ptr__ = local_80;
          goto LAB_0014bfc5;
        }
        local_c0 = (word *)CONCAT71(local_c0._1_7_,bVar7 == 6);
        if (bVar7 != 1) {
          if (bVar7 == 6) {
            uVar15 = (ulong)(uVar11 + (uVar11 == 0));
          }
          else {
            elementSize = (StructSize)
                          (((uint)elementSize & 0xffff) + (uint)(((uint)elementSize & 0xffff) == 0))
            ;
          }
          uVar11 = *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)bVar7 * 4);
          local_98 = (ulong)((uint)elementSize & 0xffff);
          local_90 = (WirePointer *)(ulong)(((uint)uVar15 & 0xffff) + ((uint)elementSize & 0xffff));
          uVar13 = (long)local_90 * (long)local_c8;
          local_b8 = pCVar20;
          local_a8 = uVar15;
          local_80 = __return_storage_ptr__;
          local_78 = (ulong)local_c8;
          if (0x1ffffffe < uVar13) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_b0);
          }
          pwVar6 = local_d8.words;
          if (((((WireValue<uint32_t> *)&(local_d8.words)->content)->value & 3) == 2) &&
             (pSVar3 = BuilderArena::getSegment
                                 ((BuilderArena *)((local_d8.segment)->super_SegmentReader).arena,
                                  (SegmentId)
                                  ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)
                                  ((long)local_d8.words + 4))->structRef), pSVar3->readOnly == false
             )) {
            uVar16 = ((WireValue<uint32_t> *)&pwVar6->content)->value;
            puVar4 = (undefined8 *)
                     ((long)&((pSVar3->super_SegmentReader).ptr.ptr)->content +
                     (ulong)(uVar16 & 0xfffffff8));
            if ((uVar16 & 4) == 0) {
              *puVar4 = 0;
            }
            else {
              *puVar4 = 0;
              puVar4[1] = 0;
            }
          }
          *pwVar6 = 0;
          if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_d8.words + 4))->upper32Bits
              != 0 || ((WireValue<uint32_t> *)&(local_d8.words)->content)->value != 0) {
            WireHelpers::zeroObject(local_d8.segment,local_b8,(WirePointer *)local_d8.words);
          }
          AVar23.words = local_d8.words;
          AVar23.segment = local_d8.segment;
          pwVar6 = (local_d8.segment)->pos;
          uVar15 = uVar13 + 1 & 0xffffffff;
          if ((long)((long)((local_d8.segment)->super_SegmentReader).ptr.ptr +
                    (((local_d8.segment)->super_SegmentReader).ptr.size_ * 8 - (long)pwVar6)) >> 3 <
              (long)uVar15) {
            pwVar6 = (word *)0x0;
          }
          else {
            (local_d8.segment)->pos = pwVar6 + uVar15;
          }
          uVar16 = (uint)(byte)local_c0;
          if (pwVar6 == (word *)0x0) {
            amount = (int)uVar13 + 2;
            pBVar14 = (BuilderArena *)((local_d8.segment)->super_SegmentReader).arena;
            if (0x1fffffff < amount) {
              local_c0 = (word *)CONCAT44(local_c0._4_4_,amount);
              local_88 = pBVar14;
              WireHelpers::allocate::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_b0);
              pBVar14 = local_88;
              amount = (SegmentWordCount)local_c0;
            }
            AVar23 = BuilderArena::allocate(pBVar14,amount);
            ((WireValue<uint32_t> *)&(local_d8.words)->content)->value =
                 (int)AVar23.words - *(int *)&((AVar23.segment)->super_SegmentReader).ptr.ptr &
                 0xfffffff8U | 2;
            *(uint *)((long)local_d8.words + 4) = ((AVar23.segment)->super_SegmentReader).id.value;
            *(undefined4 *)&(AVar23.words)->content = 1;
            pwVar6 = AVar23.words + 1;
          }
          else {
            ((WireValue<uint32_t> *)&(local_d8.words)->content)->value =
                 ((uint)((ulong)((long)pwVar6 - (long)local_d8.words) >> 1) & 0xfffffffc) - 3;
          }
          pSVar3 = local_70;
          local_d8.words = AVar23.words;
          local_88 = (BuilderArena *)CONCAT44(local_88._4_4_,uVar16 * 0x40 + uVar11);
          *(int *)((long)&(local_d8.words)->content + 4) = (int)uVar13 * 8 + 7;
          pwVar5 = pwVar6 + 1;
          *(int *)&pwVar6->content = (int)local_c8 * 4;
          *(StructDataWordCount *)((long)&pwVar6->content + 4) = elementSize.data;
          *(short *)((long)&pwVar6->content + 6) = (short)local_a8;
          iVar17 = (int)local_90;
          local_c0 = pwVar5;
          local_d8 = AVar23;
          if (bVar7 == 6) {
            if (7 < uVar19) {
              pWVar9 = (WirePointer *)(pwVar5 + local_98);
              uVar15 = (ulong)local_c8 & 0xffffffff;
              pWVar10 = local_a0;
              do {
                WireHelpers::transferPointer(local_d8.segment,pWVar9,pSVar3,pWVar10);
                pWVar10 = pWVar10 + 1;
                pWVar9 = (WirePointer *)
                         ((long)&(pWVar9->offsetAndKind).value + (ulong)(uint)(iVar17 * 8));
                uVar11 = (int)uVar15 - 1;
                uVar15 = (ulong)uVar11;
              } while (uVar11 != 0);
            }
          }
          else if (7 < uVar19) {
            uVar13 = (ulong)(uVar11 >> 3);
            uVar15 = (ulong)local_c8 & 0xffffffff;
            pWVar9 = local_a0;
            do {
              if (0xfffffffffffffffb < (ulong)bVar7 - 6) {
                memcpy(pwVar5,pWVar9,uVar13);
              }
              pWVar9 = (WirePointer *)((long)&(pWVar9->offsetAndKind).value + uVar13);
              pwVar5 = (word *)((long)&pwVar5->content + (ulong)(uint)(iVar17 * 8));
              uVar11 = (int)uVar15 - 1;
              uVar15 = (ulong)uVar11;
            } while (uVar11 != 0);
          }
          uVar13 = ((ulong)local_88 & 0xffffffff) * local_78;
          uVar15 = uVar13 + 0x3f;
          if (0x7ffffff80 < uVar13) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_b0);
          }
          __return_storage_ptr__ = local_80;
          pCVar20 = local_b8;
          SVar8 = (StructPointerCount)local_a8;
          if ((int)(uVar15 >> 6) != 0) {
            memset(local_a0,0,(ulong)((uint)(uVar15 >> 3) & 0xfffffff8));
          }
          __return_storage_ptr__->segment = local_d8.segment;
          __return_storage_ptr__->capTable = pCVar20;
          __return_storage_ptr__->ptr = (byte *)local_c0;
          __return_storage_ptr__->elementCount = (ListElementCount)local_c8;
          __return_storage_ptr__->step = (int)local_90 << 6;
          __return_storage_ptr__->structDataSize = (int)local_98 << 6;
          goto LAB_0014bfbf;
        }
        local_b8 = pCVar20;
        local_80 = __return_storage_ptr__;
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                  (&local_b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x603,FAILED,"oldSize != ElementSize::BIT",
                   "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                   ,(char (*) [106])
                    "Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                  );
        kj::_::Debug::Fault::~Fault(&local_b0);
        pCVar20 = local_b8;
      }
    }
    else {
      getStructList();
    }
LAB_0014b68c:
    if (((WirePointer *)defaultValue == (WirePointer *)0x0) ||
       ((((WirePointer *)defaultValue)->field_1).upper32Bits == 0 &&
        (((WirePointer *)defaultValue)->offsetAndKind).value == 0)) {
      __return_storage_ptr__->ptr = (byte *)0x0;
      __return_storage_ptr__->elementCount = 0;
      __return_storage_ptr__->step = 0;
      __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
      __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
LAB_0014bfc5:
      __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
      return __return_storage_ptr__;
    }
    local_a0 = (WirePointer *)
               WireHelpers::copyMessage
                         (&local_d8.segment,pCVar20,(WirePointer **)&local_d8.words,
                          (WirePointer *)defaultValue);
    defaultValue = (word *)0x0;
  } while( true );
}

Assistant:

ListBuilder PointerBuilder::getStructList(StructSize elementSize, const word* defaultValue) {
  return WireHelpers::getWritableStructListPointer(
      pointer, segment, capTable, elementSize, defaultValue);
}